

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

bool __thiscall wabt::WastLexer::MatchString(WastLexer *this,string_view s)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  const_iterator pcVar4;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  char *saved_cursor;
  WastLexer *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (WastLexer *)s.data_;
  pcVar2 = this->cursor_;
  __end1 = string_view::begin((string_view *)&this_local);
  pcVar4 = string_view::end((string_view *)&this_local);
  while( true ) {
    if (__end1 == pcVar4) {
      return true;
    }
    cVar1 = *__end1;
    iVar3 = ReadChar(this);
    if (iVar3 != cVar1) break;
    __end1 = __end1 + 1;
  }
  this->cursor_ = pcVar2;
  return false;
}

Assistant:

bool WastLexer::MatchString(string_view s) {
  const char* saved_cursor = cursor_;
  for (char c : s) {
    if (ReadChar() != c) {
      cursor_ = saved_cursor;
      return false;
    }
  }
  return true;
}